

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi_load_from_file(FILE *f,int *x,int *y,int *comp,int req_comp)

{
  undefined1 local_110 [8];
  stbi__context s;
  uchar *result;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  FILE *f_local;
  
  stbi__start_file((stbi__context *)local_110,f);
  s.img_buffer_original_end =
       stbi__load_and_postprocess_8bit((stbi__context *)local_110,x,y,comp,req_comp);
  if (s.img_buffer_original_end != (uchar *)0x0) {
    fseek((FILE *)f,(long)-((int)s.img_buffer - s.buffer_start._120_4_),1);
  }
  return s.img_buffer_original_end;
}

Assistant:

STBIDEF stbi_uc *stbi_load_from_file(FILE *f, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s;
   stbi__start_file(&s,f);
   result = stbi__load_and_postprocess_8bit(&s,x,y,comp,req_comp);
   if (result) {
      // need to 'unget' all the characters in the IO buffer
      fseek(f, - (int) (s.img_buffer_end - s.img_buffer), SEEK_CUR);
   }
   return result;
}